

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean flush_bits(working_state *state)

{
  ulong uVar1;
  byte bVar2;
  boolean bVar3;
  long *in_RDI;
  size_t bytestocopy;
  size_t bytes;
  int localbuf;
  int put_bits;
  simd_bit_buf_type put_buffer;
  JOCTET temp;
  JOCTET *buffer;
  JOCTET _buffer [512];
  working_state *in_stack_fffffffffffffda8;
  size_t local_250;
  ulong local_240;
  int local_234;
  ulong local_230;
  byte *local_220;
  byte local_218 [520];
  long *local_10;
  
  if ((int)in_RDI[7] == 0) {
    local_234 = (int)in_RDI[3];
    local_230 = in_RDI[2];
  }
  else {
    local_234 = (int)in_RDI[3];
    local_230 = in_RDI[2];
  }
  local_234 = 0x40 - local_234;
  uVar1 = in_RDI[1];
  local_10 = in_RDI;
  if (0x1ff < uVar1) {
    local_220 = (byte *)*in_RDI;
  }
  else {
    local_220 = local_218;
  }
  while (7 < local_234) {
    local_234 = local_234 + -8;
    bVar2 = (byte)(local_230 >> ((byte)local_234 & 0x3f));
    *local_220 = bVar2;
    local_220[1] = 0;
    local_220 = local_220 + -(long)(int)((bVar2 != 0xff) - 2);
  }
  if (local_234 != 0) {
    bVar2 = (byte)(local_230 << (8 - (byte)local_234 & 0x3f)) |
            (byte)(0xff >> ((byte)local_234 & 0x1f));
    *local_220 = bVar2;
    local_220[1] = 0;
    local_220 = local_220 + -(long)(int)((bVar2 != 0xff) - 2);
  }
  if ((int)local_10[7] == 0) {
    local_10[2] = 0;
    *(undefined4 *)(local_10 + 3) = 0x40;
  }
  else {
    local_10[2] = 0;
    *(undefined4 *)(local_10 + 3) = 0x40;
  }
  if (0x1ff < uVar1) {
    local_10[1] = local_10[1] - ((long)local_220 - *local_10);
    *local_10 = (long)local_220;
  }
  else {
    local_240 = (long)local_220 - (long)local_218;
    local_220 = local_218;
    for (; local_240 != 0; local_240 = local_240 - local_250) {
      if (local_240 < (ulong)local_10[1]) {
        local_250 = local_240;
      }
      else {
        local_250 = local_10[1];
      }
      memcpy((void *)*local_10,local_220,local_250);
      *local_10 = local_250 + *local_10;
      local_220 = local_220 + local_250;
      local_10[1] = local_10[1] - local_250;
      if ((local_10[1] == 0) && (bVar3 = dump_buffer(in_stack_fffffffffffffda8), bVar3 == 0)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

LOCAL(boolean)
flush_bits(working_state *state)
{
  JOCTET _buffer[BUFSIZE], *buffer, temp;
  simd_bit_buf_type put_buffer;  int put_bits;
  int localbuf = 0;

  if (state->simd) {
#if defined(__aarch64__) && !defined(NEON_INTRINSICS)
    put_bits = state->cur.free_bits;
#else
    put_bits = SIMD_BIT_BUF_SIZE - state->cur.free_bits;
#endif
    put_buffer = state->cur.put_buffer.simd;
  } else {
    put_bits = BIT_BUF_SIZE - state->cur.free_bits;
    put_buffer = state->cur.put_buffer.c;
  }

  LOAD_BUFFER()

  while (put_bits >= 8) {
    put_bits -= 8;
    temp = (JOCTET)(put_buffer >> put_bits);
    EMIT_BYTE(temp)
  }
  if (put_bits) {
    /* fill partial byte with ones */
    temp = (JOCTET)((put_buffer << (8 - put_bits)) | (0xFF >> put_bits));
    EMIT_BYTE(temp)
  }

  if (state->simd) {                    /* and reset bit buffer to empty */
    state->cur.put_buffer.simd = 0;
#if defined(__aarch64__) && !defined(NEON_INTRINSICS)
    state->cur.free_bits = 0;
#else
    state->cur.free_bits = SIMD_BIT_BUF_SIZE;
#endif
  } else {
    state->cur.put_buffer.c = 0;
    state->cur.free_bits = BIT_BUF_SIZE;
  }
  STORE_BUFFER()

  return TRUE;
}